

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibAPI.h
# Opt level: O2

bool __thiscall luna::StackAPI::CheckArgs<luna::ValueT>(StackAPI *this,int minCount,ValueT types)

{
  bool bVar1;
  int params;
  
  params = GetStackSize(this);
  if (params < minCount) {
    ArgCountError(this,minCount);
    return false;
  }
  bVar1 = CheckArgs<>(this,0,params,types);
  return bVar1;
}

Assistant:

bool CheckArgs(int minCount, ValueTypes... types)
        {
            // Check count of arguments
            auto params = GetStackSize();
            if (params < minCount)
            {
                ArgCountError(minCount);
                return false;
            }

            return CheckArgs(0, params, types...);
        }